

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O0

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::pop_and_wait
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,packaged_task<void_()> *item)

{
  bool bVar1;
  reference __other;
  undefined1 local_28 [8];
  unique_lock<std::mutex> m;
  packaged_task<void_()> *item_local;
  NotLockFreeQueue<std::packaged_task<void_()>_> *this_local;
  
  m._8_8_ = item;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex);
  bVar1 = std::
          queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
          ::empty(&this->queue);
  if (bVar1) {
    std::condition_variable::
    wait<NotLockFreeQueue<std::packaged_task<void()>>::pop_and_wait(std::packaged_task<void()>&)::_lambda()_1_>
              (&this->cond_var_pop,(unique_lock<std::mutex> *)local_28,(anon_class_8_1_8991fb9c)this
              );
  }
  __other = std::
            queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
            ::front(&this->queue);
  std::packaged_task<void_()>::operator=((packaged_task<void_()> *)m._8_8_,__other);
  std::
  queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
  ::pop(&this->queue);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_28);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void NotLockFreeQueue<T>::pop_and_wait(T& item) {
    std::unique_lock<std::mutex> m(mutex);
    if (queue.empty()) {
        cond_var_pop.wait(m, [this]{return !queue.empty();});
    }
    item = std::move(queue.front());
    queue.pop();
    m.unlock();
    cond_var_push.notify_one();
}